

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskUniqueSetCase::verifySampleBuffers
          (SampleMaskUniqueSetCase *this,
          vector<tcu::Surface,_std::allocator<tcu::Surface>_> *resultBuffers)

{
  int iVar1;
  int ndx;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  for (lVar2 = 0;
      iVar1 = (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
              super_MultisampleRenderCase.m_numTargetSamples, lVar2 < iVar1; lVar2 = lVar2 + 1) {
    tcu::Surface::operator=
              ((this->m_iterationSampleBuffers).
               super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
               super__Vector_impl_data._M_start +
               (iVar1 * (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.m_iteration + (int)lVar2),
               (Surface *)
               ((long)&((resultBuffers->
                        super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                        super__Vector_impl_data._M_start)->m_width + lVar3));
    lVar3 = lVar3 + 0x18;
  }
  return true;
}

Assistant:

bool SampleMaskUniqueSetCase::verifySampleBuffers (const std::vector<tcu::Surface>& resultBuffers)
{
	// we need results from all passes to do verification. Store results and verify later (at postTest).

	DE_ASSERT(m_numTargetSamples == (int)resultBuffers.size());
	for (int ndx = 0; ndx < m_numTargetSamples; ++ndx)
		m_iterationSampleBuffers[m_iteration * m_numTargetSamples + ndx] = resultBuffers[ndx];

	return true;
}